

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3Module.cpp
# Opt level: O2

void __thiscall w3Module::read_functions(w3Module *this,uint8_t **cursor)

{
  pointer pwVar1;
  uint32_t uVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  printf("reading section 3 offset:%lX\n",(long)*cursor - (long)this->base);
  sVar3 = ((long)(this->functions).super__Vector_base<w3Function,_std::allocator<w3Function>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->functions).super__Vector_base<w3Function,_std::allocator<w3Function>_>.
                _M_impl.super__Vector_impl_data._M_start) / 0x28;
  if (sVar3 != this->import_function_count) {
    AssertFailed("old == import_function_count");
  }
  uVar2 = read_varuint32(this,cursor);
  uVar5 = (ulong)uVar2;
  std::vector<w3Function,_std::allocator<w3Function>_>::resize(&this->functions,sVar3 + uVar5);
  lVar6 = sVar3 * 0x28;
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    printf("read_function %lX:%lX\n",uVar4,uVar5);
    pwVar1 = (this->functions).super__Vector_base<w3Function,_std::allocator<w3Function>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = read_varuint32(this,cursor);
    *(ulong *)((long)&pwVar1->function_type_index + lVar6) = (ulong)uVar2;
    *(size_t *)((long)&pwVar1->function_index + lVar6) = sVar3 + uVar4;
    (&pwVar1->import)[lVar6] = false;
    lVar6 = lVar6 + 0x28;
  }
  puts("read section 3");
  return;
}

Assistant:

void w3Module::read_functions (uint8_t** cursor)
{
    printf ("reading section 3 offset:%" FORMAT_SIZE "X\n", (long_t)(*cursor - this->base));
    const size_t old = functions.size ();
    Assert (old == import_function_count);
    const size_t size = read_varuint32 (cursor);
    functions.resize (old + size);
    for (size_t i = 0; i < size; ++i)
    {
        printf ("read_function %" FORMAT_SIZE "X:%" FORMAT_SIZE "X\n", i, size);
        w3Function& a = functions [old + i];
        a.function_type_index = read_varuint32 (cursor);
        a.function_index = i + old; // TODO probably not needed
        a.import = false; // TODO probably not needed
    }
    printf ("read section 3\n");
}